

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *rpaths)

{
  string *psVar1;
  pointer pcVar2;
  cmRuntimeDependencyArchive *this_00;
  undefined8 uVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  cmUVProcessChainBuilder *this_01;
  Status *pSVar8;
  uv_loop_t *loop;
  istream *piVar9;
  cmUVProcessChain process;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  RegularExpressionMatch pathMatch;
  ostringstream e;
  cmUVProcessChainBuilder builder;
  cmUVPipeIStream output;
  string local_6b8;
  undefined1 local_698 [16];
  StdioConfiguration local_688;
  pointer local_680;
  undefined1 local_678;
  undefined7 uStack_677;
  undefined1 local_668 [32];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_648;
  undefined1 local_640 [16];
  undefined1 local_630 [504];
  undefined1 local_438 [112];
  ios_base local_3c8 [408];
  cmUVProcessChainBuilder local_230;
  undefined1 local_1d0 [136];
  uv_handle_ptr_base_<uv_pipe_s> local_148;
  undefined8 local_138 [33];
  
  local_668._0_8_ = (pointer)0x0;
  local_668._8_8_ = (pointer)0x0;
  local_668._16_8_ = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool).Archive;
  pcVar2 = local_438 + 0x10;
  local_698._8_8_ = file;
  local_668._24_8_ = libs;
  local_648 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rpaths;
  local_438._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"otool","");
  bVar4 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)local_438,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_668);
  if ((pointer)local_438._0_8_ != pcVar2) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  if (bVar4) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_668,
               (char (*) [3])0x7e9993);
    uVar3 = local_698._8_8_;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_668,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698._8_8_)
    ;
    cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_230);
    this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&local_230,Stream_OUTPUT);
    cmUVProcessChainBuilder::AddCommand
              (this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_668);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_698);
    bVar4 = cmUVProcessChain::Valid((cmUVProcessChain *)local_698);
    if ((bVar4) &&
       (pSVar8 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_698,0),
       pSVar8->SpawnResult == 0)) {
      local_688 = (StdioConfiguration)((long)local_698 + 0x20);
      local_680 = (pointer)0x0;
      local_678 = 0;
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::rpathRegex == '\0') &&
         (iVar7 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::rpathRegex), iVar7 != 0)) {
        GetFileInfo::rpathRegex.regmust = (char *)0x0;
        GetFileInfo::rpathRegex.program = (char *)0x0;
        GetFileInfo::rpathRegex.progsize = 0;
        memset(&GetFileInfo::rpathRegex,0,0x20a);
        cmsys::RegularExpression::compile(&GetFileInfo::rpathRegex,"^ *cmd LC_RPATH$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::rpathRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::loadDylibRegex == '\0') &&
         (iVar7 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::loadDylibRegex), iVar7 != 0)) {
        GetFileInfo::loadDylibRegex.regmust = (char *)0x0;
        GetFileInfo::loadDylibRegex.program = (char *)0x0;
        GetFileInfo::loadDylibRegex.progsize = 0;
        memset(&GetFileInfo::loadDylibRegex,0,0x20a);
        cmsys::RegularExpression::compile
                  (&GetFileInfo::loadDylibRegex,"^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::loadDylibRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::loadDylibRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::pathRegex == '\0') &&
         (iVar7 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::pathRegex), iVar7 != 0)) {
        GetFileInfo::pathRegex.regmust = (char *)0x0;
        GetFileInfo::pathRegex.program = (char *)0x0;
        GetFileInfo::pathRegex.progsize = 0;
        memset(&GetFileInfo::pathRegex,0,0x20a);
        cmsys::RegularExpression::compile
                  (&GetFileInfo::pathRegex,"^ *path (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::pathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::pathRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::nameRegex == '\0') &&
         (iVar7 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::nameRegex), iVar7 != 0)) {
        GetFileInfo::nameRegex.regmust = (char *)0x0;
        GetFileInfo::nameRegex.program = (char *)0x0;
        GetFileInfo::nameRegex.progsize = 0;
        memset(&GetFileInfo::nameRegex,0,0x20a);
        cmsys::RegularExpression::compile
                  (&GetFileInfo::nameRegex,"^ *name (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::nameRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::nameRegex);
      }
      loop = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_698);
      iVar7 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_698);
      cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
                ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)local_1d0,loop,iVar7);
      psVar1 = (string *)(local_698 + 0x10);
      do {
        do {
          cVar6 = (char)(istream *)local_1d0;
          cVar5 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar6);
          piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_1d0,psVar1,cVar5);
          if (((&piVar9->field_0x20)[(long)piVar9->_vptr_basic_istream[-3]] & 5) != 0) {
            bVar4 = cmUVProcessChain::Wait((cmUVProcessChain *)local_698,0);
            uVar3 = local_698._8_8_;
            if (bVar4) {
              pSVar8 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_698,0);
              if (pSVar8->ExitStatus == 0) {
                bVar4 = true;
                goto LAB_005654ad;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_438,"Failed to run otool on:\n  ",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_438,*(char **)uVar3,*(size_type *)(uVar3 + 8));
              std::__cxx11::stringbuf::str();
              cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                        (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,
                         (string *)local_640);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_438,"Failed to wait on otool process for:\n  ",0x27);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_438,*(char **)uVar3,*(size_type *)(uVar3 + 8));
              std::__cxx11::stringbuf::str();
              cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                        (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,
                         (string *)local_640);
            }
            if ((uv_loop_t *)local_640._0_8_ != (uv_loop_t *)local_630) {
              operator_delete((void *)local_640._0_8_,local_630._0_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
            std::ios_base::~ios_base(local_3c8);
            goto LAB_005654ab;
          }
          memset((RegularExpressionMatch *)local_438,0,0x208);
          bVar4 = cmsys::RegularExpression::find
                            (&GetFileInfo::rpathRegex,(char *)local_688,
                             (RegularExpressionMatch *)local_438);
          if (bVar4) {
            cVar5 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar6);
            piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_1d0,psVar1,cVar5);
            if (((&piVar9->field_0x20)[(long)piVar9->_vptr_basic_istream[-3]] & 5) == 0) {
              cVar6 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar6);
              piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)local_1d0,psVar1,cVar6);
              if (((&piVar9->field_0x20)[(long)piVar9->_vptr_basic_istream[-3]] & 5) == 0) {
                memset((RegularExpressionMatch *)local_640,0,0x208);
                bVar4 = cmsys::RegularExpression::find
                                  (&GetFileInfo::pathRegex,(char *)local_688,
                                   (RegularExpressionMatch *)local_640);
                if (bVar4) {
                  if ((char *)local_640._8_8_ == (char *)0x0) {
                    local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
                    local_6b8._M_string_length = 0;
                    local_6b8.field_2._M_local_buf[0] = '\0';
                  }
                  else {
                    local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_6b8,local_640._8_8_,local_630._248_8_);
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>(local_648,&local_6b8);
                }
                else {
                  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_6b8,"Invalid output from otool","");
                  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                            (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_6b8)
                  ;
                }
                goto LAB_005652d6;
              }
            }
            local_640._0_8_ = local_630;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_640,"Invalid output from otool","");
            cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                      (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,
                       (string *)local_640);
LAB_00565491:
            if ((uv_loop_t *)local_640._0_8_ != (uv_loop_t *)local_630) {
              operator_delete((void *)local_640._0_8_,local_630._0_8_ + 1);
            }
            goto LAB_005654ab;
          }
          bVar4 = cmsys::RegularExpression::find
                            (&GetFileInfo::loadDylibRegex,(char *)local_688,
                             (RegularExpressionMatch *)local_438);
        } while (!bVar4);
        cVar5 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar6);
        piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1d0,psVar1,cVar5);
        if (((&piVar9->field_0x20)[(long)piVar9->_vptr_basic_istream[-3]] & 5) != 0) {
LAB_00565460:
          local_640._0_8_ = local_630;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_640,"Invalid output from otool","");
          cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                    (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_640
                    );
          goto LAB_00565491;
        }
        cVar6 = std::ios::widen((char)*(_func_int **)(local_1d0._0_8_ + -0x18) + cVar6);
        piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1d0,psVar1,cVar6);
        if (((&piVar9->field_0x20)[(long)piVar9->_vptr_basic_istream[-3]] & 5) != 0)
        goto LAB_00565460;
        memset((RegularExpressionMatch *)local_640,0,0x208);
        bVar4 = cmsys::RegularExpression::find
                          (&GetFileInfo::nameRegex,(char *)local_688,
                           (RegularExpressionMatch *)local_640);
        if (bVar4) {
          if ((char *)local_640._8_8_ == (char *)0x0) {
            local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
            local_6b8._M_string_length = 0;
            local_6b8.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6b8,local_640._8_8_,local_630._248_8_);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     local_668._24_8_,&local_6b8);
        }
        else {
          local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6b8,"Invalid output from otool","");
          cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                    (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_6b8);
        }
LAB_005652d6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
          operator_delete(local_6b8._M_dataplus._M_p,
                          CONCAT71(local_6b8.field_2._M_allocated_capacity._1_7_,
                                   local_6b8.field_2._M_local_buf[0]) + 1);
        }
      } while (bVar4 != false);
LAB_005654ab:
      bVar4 = false;
LAB_005654ad:
      local_1d0._0_8_ = cmBasicUVPipeIStream<char,std::char_traits<char>>::vtable + 0x18;
      local_138[0] = 0xa2a498;
      ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_148);
      local_1d0._0_8_ =
           cmBasicUVIStream<char,std::char_traits<char>>-in-cmBasicUVPipeIStream<char,std::char_traits<char>>
           ::construction_vtable + 0x18;
      local_138[0] = 0xa2a518;
      cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf
                ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)(local_1d0 + 0x10));
      local_1d0._0_8_ =
           std::istream-in-cmBasicUVPipeIStream<char,std::char_traits<char>>::construction_vtable +
           0x18;
      local_138[0] = 0xa2a580;
      local_1d0._8_8_ = 0;
      std::ios_base::~ios_base((ios_base *)local_138);
      if (local_688 != (StdioConfiguration)((long)local_698 + 0x20)) {
        operator_delete((void *)local_688,CONCAT71(uStack_677,local_678) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_438,"Failed to start otool process for:\n  ",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_438,*(char **)uVar3,*(size_type *)(uVar3 + 8));
      std::__cxx11::stringbuf::str();
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_640);
      if ((uv_loop_t *)local_640._0_8_ != (uv_loop_t *)local_630) {
        operator_delete((void *)local_640._0_8_,local_630._0_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      bVar4 = false;
    }
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_698);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.WorkingDirectory._M_dataplus._M_p != &local_230.WorkingDirectory.field_2) {
      operator_delete(local_230.WorkingDirectory._M_dataplus._M_p,
                      local_230.WorkingDirectory.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
    ::~vector(&local_230.Processes);
  }
  else {
    local_438._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Could not find otool","");
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_438);
    if ((pointer)local_438._0_8_ != pcVar2) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    bVar4 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_668);
  return bVar4;
}

Assistant:

bool cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& libs,
  std::vector<std::string>& rpaths)
{
  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("otool", command)) {
    this->SetError("Could not find otool");
    return false;
  }
  command.emplace_back("-l");
  command.emplace_back(file);

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    std::ostringstream e;
    e << "Failed to start otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression rpathRegex("^ *cmd LC_RPATH$");
  static const cmsys::RegularExpression loadDylibRegex(
    "^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
  static const cmsys::RegularExpression pathRegex(
    "^ *path (.*) \\(offset [0-9]+\\)$");
  static const cmsys::RegularExpression nameRegex(
    "^ *name (.*) \\(offset [0-9]+\\)$");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (std::getline(output, line)) {
    cmsys::RegularExpressionMatch cmdMatch;
    if (rpathRegex.find(line.c_str(), cmdMatch)) {
      // NOLINTNEXTLINE(misc-redundant-expression)
      if (!std::getline(output, line) || !std::getline(output, line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch pathMatch;
      if (pathRegex.find(line.c_str(), pathMatch)) {
        rpaths.push_back(pathMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    } else if (loadDylibRegex.find(line.c_str(), cmdMatch)) {
      // NOLINTNEXTLINE(misc-redundant-expression)
      if (!std::getline(output, line) || !std::getline(output, line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch nameMatch;
      if (nameRegex.find(line.c_str(), nameMatch)) {
        libs.push_back(nameMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run otool on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}